

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roundtrip.cpp
# Opt level: O0

void (anonymous_namespace)::
     roundtrip_into<std::array<std::vector<int,std::allocator<int>>,10ul>,std::array<std::vector<int,std::allocator<int>>,10ul>>
               (array<std::vector<int,_std::allocator<int>_>,_10UL> *in,
               array<std::vector<int,_std::allocator<int>_>,_10UL> *out)

{
  InputStream *istream_00;
  Enum EVar1;
  Expression_lhs<unsigned_long> EVar2;
  InputStream istream;
  OutputStream ostream;
  stringstream stream;
  OutputStream *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  fpos local_200 [16];
  streamoff local_1f0;
  ExpressionDecomposer local_1e4;
  unsigned_long local_1e0;
  Enum local_1d8;
  unsigned_long *in_stack_fffffffffffffe40;
  Expression_lhs<unsigned_long> *in_stack_fffffffffffffe48;
  long local_198 [13];
  Result *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffee4;
  char *in_stack_fffffffffffffee8;
  Enum in_stack_fffffffffffffef4;
  
  std::__cxx11::stringstream::stringstream((stringstream *)local_198);
  std::ios::exceptions((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  mserialize::serialize<std::array<std::vector<int,std::allocator<int>>,10ul>,OutputStream>
            ((array<std::vector<int,_std::allocator<int>_>,_10UL> *)
             CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdb8
            );
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e4,DT_CHECK);
  local_200 = (fpos  [16])std::ostream::tellp();
  local_1f0 = std::fpos::operator_cast_to_long(local_200);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)
                     CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                     (unsigned_long *)in_stack_fffffffffffffdb8);
  local_1e0 = EVar2.lhs;
  EVar1 = EVar2.m_at;
  local_1d8 = EVar1;
  istream_00 = (InputStream *)
               mserialize::serialized_size<std::array<std::vector<int,std::allocator<int>>,10ul>>
                         ((array<std::vector<int,_std::allocator<int>_>,_10UL> *)0x148d73);
  doctest::detail::Expression_lhs<unsigned_long>::operator==
            (in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  doctest::detail::decomp_assert
            (in_stack_fffffffffffffef4,in_stack_fffffffffffffee8,in_stack_fffffffffffffee4,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  doctest::detail::Result::~Result((Result *)0x148dc6);
  mserialize::deserialize<std::array<std::vector<int,std::allocator<int>>,10ul>,InputStream>
            ((array<std::vector<int,_std::allocator<int>_>,_10UL> *)
             CONCAT44(EVar1,in_stack_fffffffffffffdc0),istream_00);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
  return;
}

Assistant:

void roundtrip_into(const In& in, Out& out)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // make sure computed serialized size is correct
  CHECK(std::size_t(stream.tellp()) == mserialize::serialized_size(in));

  // deserialize
  InputStream istream{stream};
  mserialize::deserialize(out, istream);
}